

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int __thiscall
CVmByteArraySource::clone
          (CVmByteArraySource *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  CVmObjPageEntry *pCVar4;
  undefined8 *puVar5;
  ulong uVar6;
  
  puVar5 = (undefined8 *)operator_new(0x38);
  uVar1 = this->arr_id;
  lVar2 = this->start_idx;
  uVar3 = this->end_idx;
  *puVar5 = &PTR__CVmDataSource_003257a8;
  puVar5[6] = 0;
  *(uint *)(puVar5 + 1) = uVar1;
  pCVar4 = G_obj_table_X.pages_[uVar1 >> 0xc];
  puVar5[2] = pCVar4 + (uVar1 & 0xfff);
  puVar5[3] = lVar2;
  puVar5[4] = lVar2;
  puVar5[5] = uVar3;
  uVar6 = (ulong)**(uint **)((long)&pCVar4[uVar1 & 0xfff].ptr_ + 8);
  if (uVar3 < uVar6) {
    uVar6 = uVar3;
  }
  puVar5[5] = uVar6;
  return (int)puVar5;
}

Assistant:

CVmDataSource *clone(VMG_ const char * /*mode*/)
    {
        return new CVmByteArraySource(
            vmg_ arr_id, start_idx, end_idx - start_idx);
    }